

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O0

void Gia_ManAddClausesSuper(Swp_Man_t *p,Gia_Obj_t *pNode,Vec_Int_t *vSuper)

{
  sat_solver *s;
  int iVar1;
  int *begin;
  int *piVar2;
  int local_38;
  int local_34;
  int pLits [2];
  int LitNode;
  int Lit;
  int RetValue;
  int i;
  Vec_Int_t *vSuper_local;
  Gia_Obj_t *pNode_local;
  Swp_Man_t *p_local;
  
  iVar1 = Gia_IsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Gia_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweeper.c"
                  ,0x271,"void Gia_ManAddClausesSuper(Swp_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
  }
  iVar1 = Gia_ObjIsAnd(pNode);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsAnd( pNode )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweeper.c"
                  ,0x272,"void Gia_ManAddClausesSuper(Swp_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
  }
  iVar1 = Gia_Obj2Lit(p->pGia,pNode);
  pLits[0] = Swp_ManLit2Lit(p,iVar1);
  for (Lit = 0; iVar1 = Vec_IntSize(vSuper), Lit < iVar1; Lit = Lit + 1) {
    pLits[1] = Vec_IntEntry(vSuper,Lit);
    local_38 = Swp_ManLit2Lit(p,pLits[1]);
    local_34 = Abc_LitNot(pLits[0]);
    iVar1 = sat_solver_addclause(p->pSat,&local_38,pLits);
    if (iVar1 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweeper.c"
                    ,0x27c,"void Gia_ManAddClausesSuper(Swp_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    iVar1 = Abc_LitNot(local_38);
    Vec_IntWriteEntry(vSuper,Lit,iVar1);
  }
  Vec_IntPush(vSuper,pLits[0]);
  s = p->pSat;
  begin = Vec_IntArray(vSuper);
  piVar2 = Vec_IntArray(vSuper);
  iVar1 = Vec_IntSize(vSuper);
  iVar1 = sat_solver_addclause(s,begin,piVar2 + iVar1);
  if (iVar1 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweeper.c"
                  ,0x283,"void Gia_ManAddClausesSuper(Swp_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
  }
  return;
}

Assistant:

static void Gia_ManAddClausesSuper( Ssc_Man_t * p, Gia_Obj_t * pNode, Vec_Int_t * vSuper )
{
    int i, RetValue, Lit, LitNode, pLits[2];
    assert( !Gia_IsComplement(pNode) );
    assert( Gia_ObjIsAnd( pNode ) );
    // suppose AND-gate is A & B = C
    // add !A => !C   or   A + !C
    // add !B => !C   or   B + !C
    LitNode = Ssc_ObjSatLit( p, Gia_Obj2Lit(p->pFraig,pNode) );
    Vec_IntForEachEntry( vSuper, Lit, i )
    {
        pLits[0] = Ssc_ObjSatLit( p, Lit );
        pLits[1] = Abc_LitNot( LitNode );
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
        // update literals
        Vec_IntWriteEntry( vSuper, i, Abc_LitNot(pLits[0]) );
    }
    // add A & B => C   or   !A + !B + C
    Vec_IntPush( vSuper, LitNode );
    RetValue = sat_solver_addclause( p->pSat, Vec_IntArray(vSuper), Vec_IntArray(vSuper) + Vec_IntSize(vSuper) );
    assert( RetValue );
    (void) RetValue;
}